

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

Type * __thiscall choc::value::Type::operator=(Type *this,Type *other)

{
  MainType MVar1;
  ComplexArray *other_00;
  undefined8 uVar2;
  Object *this_00;
  Allocator *pAVar3;
  Object *pOVar4;
  
  MVar1 = this->mainType;
  if ((char)MVar1 < '\0') {
    if (MVar1 == object) {
      pOVar4 = (this->content).object;
      if (pOVar4 == (Object *)0x0) goto LAB_001e40c3;
      pAVar3 = this->allocator;
      Object::~Object(pOVar4);
    }
    else {
      if ((MVar1 != complexArray) || (pOVar4 = (this->content).object, pOVar4 == (Object *)0x0))
      goto LAB_001e40c3;
      pAVar3 = this->allocator;
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)pOVar4);
    }
    if (pAVar3 == (Allocator *)0x0) {
      free(pOVar4);
    }
    else {
      (**(code **)(*(long *)pAVar3 + 0x20))(pAVar3);
    }
  }
LAB_001e40c3:
  MVar1 = other->mainType;
  this->mainType = MVar1;
  if (MVar1 == object) {
    pAVar3 = this->allocator;
    pOVar4 = (other->content).object;
    if (pAVar3 == (Allocator *)0x0) {
      this_00 = (Object *)malloc(0x28);
      pAVar3 = (Allocator *)0x0;
    }
    else {
      this_00 = (Object *)(**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,0x28);
      pAVar3 = this->allocator;
    }
    Object::Object(this_00,pAVar3,pOVar4);
  }
  else {
    if (MVar1 != complexArray) {
      uVar2 = *(undefined8 *)((long)&other->content + 8);
      (this->content).object = (other->content).object;
      *(undefined8 *)((long)&this->content + 8) = uVar2;
      return this;
    }
    pAVar3 = this->allocator;
    other_00 = (other->content).complexArray;
    if (pAVar3 == (Allocator *)0x0) {
      this_00 = (Object *)malloc(0x18);
      pAVar3 = (Allocator *)0x0;
    }
    else {
      this_00 = (Object *)(**(code **)(*(long *)pAVar3 + 0x10))(pAVar3,0x18);
      pAVar3 = this->allocator;
    }
    ComplexArray::ComplexArray((ComplexArray *)this_00,pAVar3,other_00);
  }
  (this->content).complexArray = (ComplexArray *)this_00;
  return this;
}

Assistant:

inline Type& Type::operator= (const Type& other)
{
    deleteAllocatedObjects();
    mainType = other.mainType;
    allocateCopy (other);
    return *this;
}